

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O0

int lstrlenA(LPCSTR lpString)

{
  int local_14;
  LPCSTR pCStack_10;
  int nChar;
  LPCSTR lpString_local;
  
  local_14 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_10 = lpString;
  if (lpString != (LPCSTR)0x0) {
    while (*pCStack_10 != '\0') {
      local_14 = local_14 + 1;
      pCStack_10 = pCStack_10 + 1;
    }
  }
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return local_14;
}

Assistant:

int
PALAPI
lstrlenA( IN LPCSTR lpString)
{
    int nChar = 0;

    PERF_ENTRY(lstrlenA);
    ENTRY("lstrlenA (lpString=%p (%s))\n", lpString?lpString:"NULL", lpString?lpString:"NULL");
    if (lpString)
    {
        while (*lpString++)
        {
            nChar++;      
        }
    }
    LOGEXIT("lstrlenA returning int %d\n", nChar);
    PERF_EXIT(lstrlenA);
    return nChar;
}